

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__vertical_scatter_with_5_coeffs_cont
               (float **outputs,float *vertical_coefficients,float *input,float *input_end)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float *in_RCX;
  float *in_RDX;
  float *in_RSI;
  undefined8 *in_RDI;
  __m128 o2;
  __m128 o1;
  __m128 o0;
  __m128 c4;
  __m128 c3;
  __m128 c2;
  __m128 c1;
  __m128 c0;
  float c4s;
  float *output4;
  float c3s;
  float *output3;
  float c2s;
  float *output2;
  float c1s;
  float *output1;
  float c0s;
  float *output0;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  float *local_b70;
  float *local_b60;
  float *local_b50;
  float *local_b40;
  float *local_b30;
  float *local_b20;
  float local_668;
  float fStack_664;
  float fStack_660;
  float fStack_65c;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float r;
  __m128 r0_1;
  __m128 o0_1;
  __m128 r3;
  __m128 r2;
  __m128 r1;
  __m128 r0;
  __m128 o3;
  
  local_b30 = (float *)*in_RDI;
  fVar1 = *in_RSI;
  local_b40 = (float *)in_RDI[1];
  fVar2 = in_RSI[1];
  local_b50 = (float *)in_RDI[2];
  fVar3 = in_RSI[2];
  local_b60 = (float *)in_RDI[3];
  fVar4 = in_RSI[3];
  local_b70 = (float *)in_RDI[4];
  fVar5 = in_RSI[4];
  for (local_b20 = in_RDX; 0x3f < (long)in_RCX - (long)local_b20; local_b20 = local_b20 + 0x10) {
    local_3e8 = (float)*(undefined8 *)local_b20;
    fStack_3e4 = (float)((ulong)*(undefined8 *)local_b20 >> 0x20);
    fStack_3e0 = (float)*(undefined8 *)(local_b20 + 2);
    fStack_3dc = (float)((ulong)*(undefined8 *)(local_b20 + 2) >> 0x20);
    local_c8 = (float)*(undefined8 *)local_b30;
    fStack_c4 = (float)((ulong)*(undefined8 *)local_b30 >> 0x20);
    fStack_c0 = (float)*(undefined8 *)(local_b30 + 2);
    fStack_bc = (float)((ulong)*(undefined8 *)(local_b30 + 2) >> 0x20);
    local_bd8 = CONCAT44(fStack_c4 + fStack_3e4 * fVar1,local_c8 + local_3e8 * fVar1);
    uStack_bd0 = CONCAT44(fStack_bc + fStack_3dc * fVar1,fStack_c0 + fStack_3e0 * fVar1);
    local_408 = (float)*(undefined8 *)(local_b20 + 4);
    fStack_404 = (float)((ulong)*(undefined8 *)(local_b20 + 4) >> 0x20);
    fStack_400 = (float)*(undefined8 *)(local_b20 + 6);
    fStack_3fc = (float)((ulong)*(undefined8 *)(local_b20 + 6) >> 0x20);
    local_e8 = (float)*(undefined8 *)(local_b30 + 4);
    fStack_e4 = (float)((ulong)*(undefined8 *)(local_b30 + 4) >> 0x20);
    fStack_e0 = (float)*(undefined8 *)(local_b30 + 6);
    fStack_dc = (float)((ulong)*(undefined8 *)(local_b30 + 6) >> 0x20);
    local_be8 = CONCAT44(fStack_e4 + fStack_404 * fVar1,local_e8 + local_408 * fVar1);
    uStack_be0 = CONCAT44(fStack_dc + fStack_3fc * fVar1,fStack_e0 + fStack_400 * fVar1);
    local_428 = (float)*(undefined8 *)(local_b20 + 8);
    fStack_424 = (float)((ulong)*(undefined8 *)(local_b20 + 8) >> 0x20);
    fStack_420 = (float)*(undefined8 *)(local_b20 + 10);
    fStack_41c = (float)((ulong)*(undefined8 *)(local_b20 + 10) >> 0x20);
    local_108 = (float)*(undefined8 *)(local_b30 + 8);
    fStack_104 = (float)((ulong)*(undefined8 *)(local_b30 + 8) >> 0x20);
    fStack_100 = (float)*(undefined8 *)(local_b30 + 10);
    fStack_fc = (float)((ulong)*(undefined8 *)(local_b30 + 10) >> 0x20);
    local_bf8 = CONCAT44(fStack_104 + fStack_424 * fVar1,local_108 + local_428 * fVar1);
    uStack_bf0 = CONCAT44(fStack_fc + fStack_41c * fVar1,fStack_100 + fStack_420 * fVar1);
    local_448 = (float)*(undefined8 *)(local_b20 + 0xc);
    fStack_444 = (float)((ulong)*(undefined8 *)(local_b20 + 0xc) >> 0x20);
    fStack_440 = (float)*(undefined8 *)(local_b20 + 0xe);
    fStack_43c = (float)((ulong)*(undefined8 *)(local_b20 + 0xe) >> 0x20);
    local_128 = (float)*(undefined8 *)(local_b30 + 0xc);
    fStack_124 = (float)((ulong)*(undefined8 *)(local_b30 + 0xc) >> 0x20);
    fStack_120 = (float)*(undefined8 *)(local_b30 + 0xe);
    fStack_11c = (float)((ulong)*(undefined8 *)(local_b30 + 0xe) >> 0x20);
    local_c08 = CONCAT44(fStack_124 + fStack_444 * fVar1,local_128 + local_448 * fVar1);
    uStack_c00 = CONCAT44(fStack_11c + fStack_43c * fVar1,fStack_120 + fStack_440 * fVar1);
    *(undefined8 *)local_b30 = local_bd8;
    *(undefined8 *)(local_b30 + 2) = uStack_bd0;
    *(undefined8 *)(local_b30 + 4) = local_be8;
    *(undefined8 *)(local_b30 + 6) = uStack_be0;
    *(undefined8 *)(local_b30 + 8) = local_bf8;
    *(undefined8 *)(local_b30 + 10) = uStack_bf0;
    *(undefined8 *)(local_b30 + 0xc) = local_c08;
    *(undefined8 *)(local_b30 + 0xe) = uStack_c00;
    local_148 = (float)*(undefined8 *)local_b40;
    fStack_144 = (float)((ulong)*(undefined8 *)local_b40 >> 0x20);
    fStack_140 = (float)*(undefined8 *)(local_b40 + 2);
    fStack_13c = (float)((ulong)*(undefined8 *)(local_b40 + 2) >> 0x20);
    local_bd8 = CONCAT44(fStack_144 + fStack_3e4 * fVar2,local_148 + local_3e8 * fVar2);
    uStack_bd0 = CONCAT44(fStack_13c + fStack_3dc * fVar2,fStack_140 + fStack_3e0 * fVar2);
    local_168 = (float)*(undefined8 *)(local_b40 + 4);
    fStack_164 = (float)((ulong)*(undefined8 *)(local_b40 + 4) >> 0x20);
    fStack_160 = (float)*(undefined8 *)(local_b40 + 6);
    fStack_15c = (float)((ulong)*(undefined8 *)(local_b40 + 6) >> 0x20);
    local_be8 = CONCAT44(fStack_164 + fStack_404 * fVar2,local_168 + local_408 * fVar2);
    uStack_be0 = CONCAT44(fStack_15c + fStack_3fc * fVar2,fStack_160 + fStack_400 * fVar2);
    local_188 = (float)*(undefined8 *)(local_b40 + 8);
    fStack_184 = (float)((ulong)*(undefined8 *)(local_b40 + 8) >> 0x20);
    fStack_180 = (float)*(undefined8 *)(local_b40 + 10);
    fStack_17c = (float)((ulong)*(undefined8 *)(local_b40 + 10) >> 0x20);
    local_bf8 = CONCAT44(fStack_184 + fStack_424 * fVar2,local_188 + local_428 * fVar2);
    uStack_bf0 = CONCAT44(fStack_17c + fStack_41c * fVar2,fStack_180 + fStack_420 * fVar2);
    local_1a8 = (float)*(undefined8 *)(local_b40 + 0xc);
    fStack_1a4 = (float)((ulong)*(undefined8 *)(local_b40 + 0xc) >> 0x20);
    fStack_1a0 = (float)*(undefined8 *)(local_b40 + 0xe);
    fStack_19c = (float)((ulong)*(undefined8 *)(local_b40 + 0xe) >> 0x20);
    local_c08 = CONCAT44(fStack_1a4 + fStack_444 * fVar2,local_1a8 + local_448 * fVar2);
    uStack_c00 = CONCAT44(fStack_19c + fStack_43c * fVar2,fStack_1a0 + fStack_440 * fVar2);
    *(undefined8 *)local_b40 = local_bd8;
    *(undefined8 *)(local_b40 + 2) = uStack_bd0;
    *(undefined8 *)(local_b40 + 4) = local_be8;
    *(undefined8 *)(local_b40 + 6) = uStack_be0;
    *(undefined8 *)(local_b40 + 8) = local_bf8;
    *(undefined8 *)(local_b40 + 10) = uStack_bf0;
    *(undefined8 *)(local_b40 + 0xc) = local_c08;
    *(undefined8 *)(local_b40 + 0xe) = uStack_c00;
    local_1c8 = (float)*(undefined8 *)local_b50;
    fStack_1c4 = (float)((ulong)*(undefined8 *)local_b50 >> 0x20);
    fStack_1c0 = (float)*(undefined8 *)(local_b50 + 2);
    fStack_1bc = (float)((ulong)*(undefined8 *)(local_b50 + 2) >> 0x20);
    local_bd8 = CONCAT44(fStack_1c4 + fStack_3e4 * fVar3,local_1c8 + local_3e8 * fVar3);
    uStack_bd0 = CONCAT44(fStack_1bc + fStack_3dc * fVar3,fStack_1c0 + fStack_3e0 * fVar3);
    local_1e8 = (float)*(undefined8 *)(local_b50 + 4);
    fStack_1e4 = (float)((ulong)*(undefined8 *)(local_b50 + 4) >> 0x20);
    fStack_1e0 = (float)*(undefined8 *)(local_b50 + 6);
    fStack_1dc = (float)((ulong)*(undefined8 *)(local_b50 + 6) >> 0x20);
    local_be8 = CONCAT44(fStack_1e4 + fStack_404 * fVar3,local_1e8 + local_408 * fVar3);
    uStack_be0 = CONCAT44(fStack_1dc + fStack_3fc * fVar3,fStack_1e0 + fStack_400 * fVar3);
    local_208 = (float)*(undefined8 *)(local_b50 + 8);
    fStack_204 = (float)((ulong)*(undefined8 *)(local_b50 + 8) >> 0x20);
    fStack_200 = (float)*(undefined8 *)(local_b50 + 10);
    fStack_1fc = (float)((ulong)*(undefined8 *)(local_b50 + 10) >> 0x20);
    local_bf8 = CONCAT44(fStack_204 + fStack_424 * fVar3,local_208 + local_428 * fVar3);
    uStack_bf0 = CONCAT44(fStack_1fc + fStack_41c * fVar3,fStack_200 + fStack_420 * fVar3);
    local_228 = (float)*(undefined8 *)(local_b50 + 0xc);
    fStack_224 = (float)((ulong)*(undefined8 *)(local_b50 + 0xc) >> 0x20);
    fStack_220 = (float)*(undefined8 *)(local_b50 + 0xe);
    fStack_21c = (float)((ulong)*(undefined8 *)(local_b50 + 0xe) >> 0x20);
    local_c08 = CONCAT44(fStack_224 + fStack_444 * fVar3,local_228 + local_448 * fVar3);
    uStack_c00 = CONCAT44(fStack_21c + fStack_43c * fVar3,fStack_220 + fStack_440 * fVar3);
    *(undefined8 *)local_b50 = local_bd8;
    *(undefined8 *)(local_b50 + 2) = uStack_bd0;
    *(undefined8 *)(local_b50 + 4) = local_be8;
    *(undefined8 *)(local_b50 + 6) = uStack_be0;
    *(undefined8 *)(local_b50 + 8) = local_bf8;
    *(undefined8 *)(local_b50 + 10) = uStack_bf0;
    *(undefined8 *)(local_b50 + 0xc) = local_c08;
    *(undefined8 *)(local_b50 + 0xe) = uStack_c00;
    local_248 = (float)*(undefined8 *)local_b60;
    fStack_244 = (float)((ulong)*(undefined8 *)local_b60 >> 0x20);
    fStack_240 = (float)*(undefined8 *)(local_b60 + 2);
    fStack_23c = (float)((ulong)*(undefined8 *)(local_b60 + 2) >> 0x20);
    local_bd8 = CONCAT44(fStack_244 + fStack_3e4 * fVar4,local_248 + local_3e8 * fVar4);
    uStack_bd0 = CONCAT44(fStack_23c + fStack_3dc * fVar4,fStack_240 + fStack_3e0 * fVar4);
    local_268 = (float)*(undefined8 *)(local_b60 + 4);
    fStack_264 = (float)((ulong)*(undefined8 *)(local_b60 + 4) >> 0x20);
    fStack_260 = (float)*(undefined8 *)(local_b60 + 6);
    fStack_25c = (float)((ulong)*(undefined8 *)(local_b60 + 6) >> 0x20);
    local_be8 = CONCAT44(fStack_264 + fStack_404 * fVar4,local_268 + local_408 * fVar4);
    uStack_be0 = CONCAT44(fStack_25c + fStack_3fc * fVar4,fStack_260 + fStack_400 * fVar4);
    local_288 = (float)*(undefined8 *)(local_b60 + 8);
    fStack_284 = (float)((ulong)*(undefined8 *)(local_b60 + 8) >> 0x20);
    fStack_280 = (float)*(undefined8 *)(local_b60 + 10);
    fStack_27c = (float)((ulong)*(undefined8 *)(local_b60 + 10) >> 0x20);
    local_bf8 = CONCAT44(fStack_284 + fStack_424 * fVar4,local_288 + local_428 * fVar4);
    uStack_bf0 = CONCAT44(fStack_27c + fStack_41c * fVar4,fStack_280 + fStack_420 * fVar4);
    local_2a8 = (float)*(undefined8 *)(local_b60 + 0xc);
    fStack_2a4 = (float)((ulong)*(undefined8 *)(local_b60 + 0xc) >> 0x20);
    fStack_2a0 = (float)*(undefined8 *)(local_b60 + 0xe);
    fStack_29c = (float)((ulong)*(undefined8 *)(local_b60 + 0xe) >> 0x20);
    local_c08 = CONCAT44(fStack_2a4 + fStack_444 * fVar4,local_2a8 + local_448 * fVar4);
    uStack_c00 = CONCAT44(fStack_29c + fStack_43c * fVar4,fStack_2a0 + fStack_440 * fVar4);
    *(undefined8 *)local_b60 = local_bd8;
    *(undefined8 *)(local_b60 + 2) = uStack_bd0;
    *(undefined8 *)(local_b60 + 4) = local_be8;
    *(undefined8 *)(local_b60 + 6) = uStack_be0;
    *(undefined8 *)(local_b60 + 8) = local_bf8;
    *(undefined8 *)(local_b60 + 10) = uStack_bf0;
    *(undefined8 *)(local_b60 + 0xc) = local_c08;
    *(undefined8 *)(local_b60 + 0xe) = uStack_c00;
    local_2c8 = (float)*(undefined8 *)local_b70;
    fStack_2c4 = (float)((ulong)*(undefined8 *)local_b70 >> 0x20);
    fStack_2c0 = (float)*(undefined8 *)(local_b70 + 2);
    fStack_2bc = (float)((ulong)*(undefined8 *)(local_b70 + 2) >> 0x20);
    local_bd8 = CONCAT44(fStack_2c4 + fStack_3e4 * fVar5,local_2c8 + local_3e8 * fVar5);
    uStack_bd0 = CONCAT44(fStack_2bc + fStack_3dc * fVar5,fStack_2c0 + fStack_3e0 * fVar5);
    local_2e8 = (float)*(undefined8 *)(local_b70 + 4);
    fStack_2e4 = (float)((ulong)*(undefined8 *)(local_b70 + 4) >> 0x20);
    fStack_2e0 = (float)*(undefined8 *)(local_b70 + 6);
    fStack_2dc = (float)((ulong)*(undefined8 *)(local_b70 + 6) >> 0x20);
    local_be8 = CONCAT44(fStack_2e4 + fStack_404 * fVar5,local_2e8 + local_408 * fVar5);
    uStack_be0 = CONCAT44(fStack_2dc + fStack_3fc * fVar5,fStack_2e0 + fStack_400 * fVar5);
    local_308 = (float)*(undefined8 *)(local_b70 + 8);
    fStack_304 = (float)((ulong)*(undefined8 *)(local_b70 + 8) >> 0x20);
    fStack_300 = (float)*(undefined8 *)(local_b70 + 10);
    fStack_2fc = (float)((ulong)*(undefined8 *)(local_b70 + 10) >> 0x20);
    local_bf8 = CONCAT44(fStack_304 + fStack_424 * fVar5,local_308 + local_428 * fVar5);
    uStack_bf0 = CONCAT44(fStack_2fc + fStack_41c * fVar5,fStack_300 + fStack_420 * fVar5);
    local_328 = (float)*(undefined8 *)(local_b70 + 0xc);
    fStack_324 = (float)((ulong)*(undefined8 *)(local_b70 + 0xc) >> 0x20);
    fStack_320 = (float)*(undefined8 *)(local_b70 + 0xe);
    fStack_31c = (float)((ulong)*(undefined8 *)(local_b70 + 0xe) >> 0x20);
    local_c08 = CONCAT44(fStack_324 + fStack_444 * fVar5,local_328 + local_448 * fVar5);
    uStack_c00 = CONCAT44(fStack_31c + fStack_43c * fVar5,fStack_320 + fStack_440 * fVar5);
    *(undefined8 *)local_b70 = local_bd8;
    *(undefined8 *)(local_b70 + 2) = uStack_bd0;
    *(undefined8 *)(local_b70 + 4) = local_be8;
    *(undefined8 *)(local_b70 + 6) = uStack_be0;
    *(undefined8 *)(local_b70 + 8) = local_bf8;
    *(undefined8 *)(local_b70 + 10) = uStack_bf0;
    *(undefined8 *)(local_b70 + 0xc) = local_c08;
    *(undefined8 *)(local_b70 + 0xe) = uStack_c00;
    local_b30 = local_b30 + 0x10;
    local_b40 = local_b40 + 0x10;
    local_b50 = local_b50 + 0x10;
    local_b60 = local_b60 + 0x10;
    local_b70 = local_b70 + 0x10;
  }
  for (; 0xf < (long)in_RCX - (long)local_b20; local_b20 = local_b20 + 4) {
    local_668 = (float)*(undefined8 *)local_b20;
    fStack_664 = (float)((ulong)*(undefined8 *)local_b20 >> 0x20);
    fStack_660 = (float)*(undefined8 *)(local_b20 + 2);
    fStack_65c = (float)((ulong)*(undefined8 *)(local_b20 + 2) >> 0x20);
    local_348 = (float)*(undefined8 *)local_b30;
    fStack_344 = (float)((ulong)*(undefined8 *)local_b30 >> 0x20);
    fStack_340 = (float)*(undefined8 *)(local_b30 + 2);
    fStack_33c = (float)((ulong)*(undefined8 *)(local_b30 + 2) >> 0x20);
    local_c58 = CONCAT44(fStack_344 + fStack_664 * fVar1,local_348 + local_668 * fVar1);
    uStack_c50 = CONCAT44(fStack_33c + fStack_65c * fVar1,fStack_340 + fStack_660 * fVar1);
    *(undefined8 *)local_b30 = local_c58;
    *(undefined8 *)(local_b30 + 2) = uStack_c50;
    local_368 = (float)*(undefined8 *)local_b40;
    fStack_364 = (float)((ulong)*(undefined8 *)local_b40 >> 0x20);
    fStack_360 = (float)*(undefined8 *)(local_b40 + 2);
    fStack_35c = (float)((ulong)*(undefined8 *)(local_b40 + 2) >> 0x20);
    local_c58 = CONCAT44(fStack_364 + fStack_664 * fVar2,local_368 + local_668 * fVar2);
    uStack_c50 = CONCAT44(fStack_35c + fStack_65c * fVar2,fStack_360 + fStack_660 * fVar2);
    *(undefined8 *)local_b40 = local_c58;
    *(undefined8 *)(local_b40 + 2) = uStack_c50;
    local_388 = (float)*(undefined8 *)local_b50;
    fStack_384 = (float)((ulong)*(undefined8 *)local_b50 >> 0x20);
    fStack_380 = (float)*(undefined8 *)(local_b50 + 2);
    fStack_37c = (float)((ulong)*(undefined8 *)(local_b50 + 2) >> 0x20);
    local_c58 = CONCAT44(fStack_384 + fStack_664 * fVar3,local_388 + local_668 * fVar3);
    uStack_c50 = CONCAT44(fStack_37c + fStack_65c * fVar3,fStack_380 + fStack_660 * fVar3);
    *(undefined8 *)local_b50 = local_c58;
    *(undefined8 *)(local_b50 + 2) = uStack_c50;
    local_3a8 = (float)*(undefined8 *)local_b60;
    fStack_3a4 = (float)((ulong)*(undefined8 *)local_b60 >> 0x20);
    fStack_3a0 = (float)*(undefined8 *)(local_b60 + 2);
    fStack_39c = (float)((ulong)*(undefined8 *)(local_b60 + 2) >> 0x20);
    local_c58 = CONCAT44(fStack_3a4 + fStack_664 * fVar4,local_3a8 + local_668 * fVar4);
    uStack_c50 = CONCAT44(fStack_39c + fStack_65c * fVar4,fStack_3a0 + fStack_660 * fVar4);
    *(undefined8 *)local_b60 = local_c58;
    *(undefined8 *)(local_b60 + 2) = uStack_c50;
    local_3c8 = (float)*(undefined8 *)local_b70;
    fStack_3c4 = (float)((ulong)*(undefined8 *)local_b70 >> 0x20);
    fStack_3c0 = (float)*(undefined8 *)(local_b70 + 2);
    fStack_3bc = (float)((ulong)*(undefined8 *)(local_b70 + 2) >> 0x20);
    local_c58 = CONCAT44(fStack_3c4 + fStack_664 * fVar5,local_3c8 + local_668 * fVar5);
    uStack_c50 = CONCAT44(fStack_3bc + fStack_65c * fVar5,fStack_3c0 + fStack_660 * fVar5);
    *(undefined8 *)local_b70 = local_c58;
    *(undefined8 *)(local_b70 + 2) = uStack_c50;
    local_b30 = local_b30 + 4;
    local_b40 = local_b40 + 4;
    local_b50 = local_b50 + 4;
    local_b60 = local_b60 + 4;
    local_b70 = local_b70 + 4;
  }
  for (; local_b20 < in_RCX; local_b20 = local_b20 + 1) {
    fVar6 = *local_b20;
    *local_b30 = fVar6 * fVar1 + *local_b30;
    *local_b40 = fVar6 * fVar2 + *local_b40;
    *local_b50 = fVar6 * fVar3 + *local_b50;
    *local_b60 = fVar6 * fVar4 + *local_b60;
    *local_b70 = fVar6 * fVar5 + *local_b70;
    local_b30 = local_b30 + 1;
    local_b40 = local_b40 + 1;
    local_b50 = local_b50 + 1;
    local_b60 = local_b60 + 1;
    local_b70 = local_b70 + 1;
  }
  return;
}

Assistant:

static void STBIR_chans( stbir__vertical_scatter_with_,_coeffs)( float ** outputs, float const * vertical_coefficients, float const * input, float const * input_end )
{
  stbIF0( float STBIR_SIMD_STREAMOUT_PTR( * ) output0 = outputs[0]; float c0s = vertical_coefficients[0]; )
  stbIF1( float STBIR_SIMD_STREAMOUT_PTR( * ) output1 = outputs[1]; float c1s = vertical_coefficients[1]; )
  stbIF2( float STBIR_SIMD_STREAMOUT_PTR( * ) output2 = outputs[2]; float c2s = vertical_coefficients[2]; )
  stbIF3( float STBIR_SIMD_STREAMOUT_PTR( * ) output3 = outputs[3]; float c3s = vertical_coefficients[3]; )
  stbIF4( float STBIR_SIMD_STREAMOUT_PTR( * ) output4 = outputs[4]; float c4s = vertical_coefficients[4]; )
  stbIF5( float STBIR_SIMD_STREAMOUT_PTR( * ) output5 = outputs[5]; float c5s = vertical_coefficients[5]; )
  stbIF6( float STBIR_SIMD_STREAMOUT_PTR( * ) output6 = outputs[6]; float c6s = vertical_coefficients[6]; )
  stbIF7( float STBIR_SIMD_STREAMOUT_PTR( * ) output7 = outputs[7]; float c7s = vertical_coefficients[7]; )

  #ifdef STBIR_SIMD
  {
    stbIF0(stbir__simdfX c0 = stbir__simdf_frepX( c0s ); )
    stbIF1(stbir__simdfX c1 = stbir__simdf_frepX( c1s ); )
    stbIF2(stbir__simdfX c2 = stbir__simdf_frepX( c2s ); )
    stbIF3(stbir__simdfX c3 = stbir__simdf_frepX( c3s ); )
    stbIF4(stbir__simdfX c4 = stbir__simdf_frepX( c4s ); )
    stbIF5(stbir__simdfX c5 = stbir__simdf_frepX( c5s ); )
    stbIF6(stbir__simdfX c6 = stbir__simdf_frepX( c6s ); )
    stbIF7(stbir__simdfX c7 = stbir__simdf_frepX( c7s ); )
    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input_end - (char*) input ) >= (16*stbir__simdfX_float_count) )
    {
      stbir__simdfX o0, o1, o2, o3, r0, r1, r2, r3;
      STBIR_SIMD_NO_UNROLL(output0);

      stbir__simdfX_load( r0, input );               stbir__simdfX_load( r1, input+stbir__simdfX_float_count );     stbir__simdfX_load( r2, input+(2*stbir__simdfX_float_count) );      stbir__simdfX_load( r3, input+(3*stbir__simdfX_float_count) );

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdfX_load( o0, output0 );     stbir__simdfX_load( o1, output0+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output0+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output0+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c0 );  stbir__simdfX_madd( o1, o1, r1, c0 );  stbir__simdfX_madd( o2, o2, r2, c0 );   stbir__simdfX_madd( o3, o3, r3, c0 );
              stbir__simdfX_store( output0, o0 );    stbir__simdfX_store( output0+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output0+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output0+(3*stbir__simdfX_float_count), o3 ); )
      stbIF1( stbir__simdfX_load( o0, output1 );     stbir__simdfX_load( o1, output1+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output1+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output1+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c1 );  stbir__simdfX_madd( o1, o1, r1, c1 );  stbir__simdfX_madd( o2, o2, r2, c1 );   stbir__simdfX_madd( o3, o3, r3, c1 );
              stbir__simdfX_store( output1, o0 );    stbir__simdfX_store( output1+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output1+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output1+(3*stbir__simdfX_float_count), o3 ); )
      stbIF2( stbir__simdfX_load( o0, output2 );     stbir__simdfX_load( o1, output2+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output2+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output2+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c2 );  stbir__simdfX_madd( o1, o1, r1, c2 );  stbir__simdfX_madd( o2, o2, r2, c2 );   stbir__simdfX_madd( o3, o3, r3, c2 );
              stbir__simdfX_store( output2, o0 );    stbir__simdfX_store( output2+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output2+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output2+(3*stbir__simdfX_float_count), o3 ); )
      stbIF3( stbir__simdfX_load( o0, output3 );     stbir__simdfX_load( o1, output3+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output3+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output3+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c3 );  stbir__simdfX_madd( o1, o1, r1, c3 );  stbir__simdfX_madd( o2, o2, r2, c3 );   stbir__simdfX_madd( o3, o3, r3, c3 );
              stbir__simdfX_store( output3, o0 );    stbir__simdfX_store( output3+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output3+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output3+(3*stbir__simdfX_float_count), o3 ); )
      stbIF4( stbir__simdfX_load( o0, output4 );     stbir__simdfX_load( o1, output4+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output4+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output4+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c4 );  stbir__simdfX_madd( o1, o1, r1, c4 );  stbir__simdfX_madd( o2, o2, r2, c4 );   stbir__simdfX_madd( o3, o3, r3, c4 );
              stbir__simdfX_store( output4, o0 );    stbir__simdfX_store( output4+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output4+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output4+(3*stbir__simdfX_float_count), o3 ); )
      stbIF5( stbir__simdfX_load( o0, output5 );     stbir__simdfX_load( o1, output5+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output5+(2*stbir__simdfX_float_count));    stbir__simdfX_load( o3, output5+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c5 );  stbir__simdfX_madd( o1, o1, r1, c5 );  stbir__simdfX_madd( o2, o2, r2, c5 );   stbir__simdfX_madd( o3, o3, r3, c5 );
              stbir__simdfX_store( output5, o0 );    stbir__simdfX_store( output5+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output5+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output5+(3*stbir__simdfX_float_count), o3 ); )
      stbIF6( stbir__simdfX_load( o0, output6 );     stbir__simdfX_load( o1, output6+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output6+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output6+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c6 );  stbir__simdfX_madd( o1, o1, r1, c6 );  stbir__simdfX_madd( o2, o2, r2, c6 );   stbir__simdfX_madd( o3, o3, r3, c6 );
              stbir__simdfX_store( output6, o0 );    stbir__simdfX_store( output6+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output6+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output6+(3*stbir__simdfX_float_count), o3 ); )
      stbIF7( stbir__simdfX_load( o0, output7 );     stbir__simdfX_load( o1, output7+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output7+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output7+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c7 );  stbir__simdfX_madd( o1, o1, r1, c7 );  stbir__simdfX_madd( o2, o2, r2, c7 );   stbir__simdfX_madd( o3, o3, r3, c7 );
              stbir__simdfX_store( output7, o0 );    stbir__simdfX_store( output7+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output7+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output7+(3*stbir__simdfX_float_count), o3 ); )
      #else
      stbIF0( stbir__simdfX_mult( o0, r0, c0 );      stbir__simdfX_mult( o1, r1, c0 );      stbir__simdfX_mult( o2, r2, c0 );       stbir__simdfX_mult( o3, r3, c0 );
              stbir__simdfX_store( output0, o0 );    stbir__simdfX_store( output0+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output0+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output0+(3*stbir__simdfX_float_count), o3 ); )
      stbIF1( stbir__simdfX_mult( o0, r0, c1 );      stbir__simdfX_mult( o1, r1, c1 );      stbir__simdfX_mult( o2, r2, c1 );       stbir__simdfX_mult( o3, r3, c1 );
              stbir__simdfX_store( output1, o0 );    stbir__simdfX_store( output1+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output1+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output1+(3*stbir__simdfX_float_count), o3 ); )
      stbIF2( stbir__simdfX_mult( o0, r0, c2 );      stbir__simdfX_mult( o1, r1, c2 );      stbir__simdfX_mult( o2, r2, c2 );       stbir__simdfX_mult( o3, r3, c2 );
              stbir__simdfX_store( output2, o0 );    stbir__simdfX_store( output2+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output2+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output2+(3*stbir__simdfX_float_count), o3 ); )
      stbIF3( stbir__simdfX_mult( o0, r0, c3 );      stbir__simdfX_mult( o1, r1, c3 );      stbir__simdfX_mult( o2, r2, c3 );       stbir__simdfX_mult( o3, r3, c3 );
              stbir__simdfX_store( output3, o0 );    stbir__simdfX_store( output3+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output3+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output3+(3*stbir__simdfX_float_count), o3 ); )
      stbIF4( stbir__simdfX_mult( o0, r0, c4 );      stbir__simdfX_mult( o1, r1, c4 );      stbir__simdfX_mult( o2, r2, c4 );       stbir__simdfX_mult( o3, r3, c4 );
              stbir__simdfX_store( output4, o0 );    stbir__simdfX_store( output4+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output4+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output4+(3*stbir__simdfX_float_count), o3 ); )
      stbIF5( stbir__simdfX_mult( o0, r0, c5 );      stbir__simdfX_mult( o1, r1, c5 );      stbir__simdfX_mult( o2, r2, c5 );       stbir__simdfX_mult( o3, r3, c5 );
              stbir__simdfX_store( output5, o0 );    stbir__simdfX_store( output5+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output5+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output5+(3*stbir__simdfX_float_count), o3 ); )
      stbIF6( stbir__simdfX_mult( o0, r0, c6 );      stbir__simdfX_mult( o1, r1, c6 );      stbir__simdfX_mult( o2, r2, c6 );       stbir__simdfX_mult( o3, r3, c6 );
              stbir__simdfX_store( output6, o0 );    stbir__simdfX_store( output6+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output6+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output6+(3*stbir__simdfX_float_count), o3 ); )
      stbIF7( stbir__simdfX_mult( o0, r0, c7 );      stbir__simdfX_mult( o1, r1, c7 );      stbir__simdfX_mult( o2, r2, c7 );       stbir__simdfX_mult( o3, r3, c7 );
              stbir__simdfX_store( output7, o0 );    stbir__simdfX_store( output7+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output7+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output7+(3*stbir__simdfX_float_count), o3 ); )
      #endif

      input += (4*stbir__simdfX_float_count);
      stbIF0( output0 += (4*stbir__simdfX_float_count); ) stbIF1( output1 += (4*stbir__simdfX_float_count); ) stbIF2( output2 += (4*stbir__simdfX_float_count); ) stbIF3( output3 += (4*stbir__simdfX_float_count); ) stbIF4( output4 += (4*stbir__simdfX_float_count); ) stbIF5( output5 += (4*stbir__simdfX_float_count); ) stbIF6( output6 += (4*stbir__simdfX_float_count); ) stbIF7( output7 += (4*stbir__simdfX_float_count); )
    }
    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input_end - (char*) input ) >= 16 )
    {
      stbir__simdf o0, r0;
      STBIR_SIMD_NO_UNROLL(output0);

      stbir__simdf_load( r0, input );

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdf_load( o0, output0 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) );  stbir__simdf_store( output0, o0 ); )
      stbIF1( stbir__simdf_load( o0, output1 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c1 ) );  stbir__simdf_store( output1, o0 ); )
      stbIF2( stbir__simdf_load( o0, output2 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c2 ) );  stbir__simdf_store( output2, o0 ); )
      stbIF3( stbir__simdf_load( o0, output3 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c3 ) );  stbir__simdf_store( output3, o0 ); )
      stbIF4( stbir__simdf_load( o0, output4 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c4 ) );  stbir__simdf_store( output4, o0 ); )
      stbIF5( stbir__simdf_load( o0, output5 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c5 ) );  stbir__simdf_store( output5, o0 ); )
      stbIF6( stbir__simdf_load( o0, output6 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c6 ) );  stbir__simdf_store( output6, o0 ); )
      stbIF7( stbir__simdf_load( o0, output7 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c7 ) );  stbir__simdf_store( output7, o0 ); )
      #else
      stbIF0( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) );   stbir__simdf_store( output0, o0 ); )
      stbIF1( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c1 ) );   stbir__simdf_store( output1, o0 ); )
      stbIF2( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c2 ) );   stbir__simdf_store( output2, o0 ); )
      stbIF3( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c3 ) );   stbir__simdf_store( output3, o0 ); )
      stbIF4( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c4 ) );   stbir__simdf_store( output4, o0 ); )
      stbIF5( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c5 ) );   stbir__simdf_store( output5, o0 ); )
      stbIF6( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c6 ) );   stbir__simdf_store( output6, o0 ); )
      stbIF7( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c7 ) );   stbir__simdf_store( output7, o0 ); )
      #endif

      input += 4;
      stbIF0( output0 += 4; ) stbIF1( output1 += 4; ) stbIF2( output2 += 4; ) stbIF3( output3 += 4; ) stbIF4( output4 += 4; ) stbIF5( output5 += 4; ) stbIF6( output6 += 4; ) stbIF7( output7 += 4; )
    }
  }
  #else
  STBIR_NO_UNROLL_LOOP_START
  while ( ( (char*)input_end - (char*) input ) >= 16 )
  {
    float r0, r1, r2, r3;
    STBIR_NO_UNROLL(input);

    r0 = input[0], r1 = input[1], r2 = input[2], r3 = input[3];

    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( output0[0] += ( r0 * c0s ); output0[1] += ( r1 * c0s ); output0[2] += ( r2 * c0s ); output0[3] += ( r3 * c0s ); )
    stbIF1( output1[0] += ( r0 * c1s ); output1[1] += ( r1 * c1s ); output1[2] += ( r2 * c1s ); output1[3] += ( r3 * c1s ); )
    stbIF2( output2[0] += ( r0 * c2s ); output2[1] += ( r1 * c2s ); output2[2] += ( r2 * c2s ); output2[3] += ( r3 * c2s ); )
    stbIF3( output3[0] += ( r0 * c3s ); output3[1] += ( r1 * c3s ); output3[2] += ( r2 * c3s ); output3[3] += ( r3 * c3s ); )
    stbIF4( output4[0] += ( r0 * c4s ); output4[1] += ( r1 * c4s ); output4[2] += ( r2 * c4s ); output4[3] += ( r3 * c4s ); )
    stbIF5( output5[0] += ( r0 * c5s ); output5[1] += ( r1 * c5s ); output5[2] += ( r2 * c5s ); output5[3] += ( r3 * c5s ); )
    stbIF6( output6[0] += ( r0 * c6s ); output6[1] += ( r1 * c6s ); output6[2] += ( r2 * c6s ); output6[3] += ( r3 * c6s ); )
    stbIF7( output7[0] += ( r0 * c7s ); output7[1] += ( r1 * c7s ); output7[2] += ( r2 * c7s ); output7[3] += ( r3 * c7s ); )
    #else
    stbIF0( output0[0]  = ( r0 * c0s ); output0[1]  = ( r1 * c0s ); output0[2]  = ( r2 * c0s ); output0[3]  = ( r3 * c0s ); )
    stbIF1( output1[0]  = ( r0 * c1s ); output1[1]  = ( r1 * c1s ); output1[2]  = ( r2 * c1s ); output1[3]  = ( r3 * c1s ); )
    stbIF2( output2[0]  = ( r0 * c2s ); output2[1]  = ( r1 * c2s ); output2[2]  = ( r2 * c2s ); output2[3]  = ( r3 * c2s ); )
    stbIF3( output3[0]  = ( r0 * c3s ); output3[1]  = ( r1 * c3s ); output3[2]  = ( r2 * c3s ); output3[3]  = ( r3 * c3s ); )
    stbIF4( output4[0]  = ( r0 * c4s ); output4[1]  = ( r1 * c4s ); output4[2]  = ( r2 * c4s ); output4[3]  = ( r3 * c4s ); )
    stbIF5( output5[0]  = ( r0 * c5s ); output5[1]  = ( r1 * c5s ); output5[2]  = ( r2 * c5s ); output5[3]  = ( r3 * c5s ); )
    stbIF6( output6[0]  = ( r0 * c6s ); output6[1]  = ( r1 * c6s ); output6[2]  = ( r2 * c6s ); output6[3]  = ( r3 * c6s ); )
    stbIF7( output7[0]  = ( r0 * c7s ); output7[1]  = ( r1 * c7s ); output7[2]  = ( r2 * c7s ); output7[3]  = ( r3 * c7s ); )
    #endif

    input += 4;
    stbIF0( output0 += 4; ) stbIF1( output1 += 4; ) stbIF2( output2 += 4; ) stbIF3( output3 += 4; ) stbIF4( output4 += 4; ) stbIF5( output5 += 4; ) stbIF6( output6 += 4; ) stbIF7( output7 += 4; )
  }
  #endif
  STBIR_NO_UNROLL_LOOP_START
  while ( input < input_end )
  {
    float r = input[0];
    STBIR_NO_UNROLL(output0);

    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( output0[0] += ( r * c0s ); )
    stbIF1( output1[0] += ( r * c1s ); )
    stbIF2( output2[0] += ( r * c2s ); )
    stbIF3( output3[0] += ( r * c3s ); )
    stbIF4( output4[0] += ( r * c4s ); )
    stbIF5( output5[0] += ( r * c5s ); )
    stbIF6( output6[0] += ( r * c6s ); )
    stbIF7( output7[0] += ( r * c7s ); )
    #else
    stbIF0( output0[0]  = ( r * c0s ); )
    stbIF1( output1[0]  = ( r * c1s ); )
    stbIF2( output2[0]  = ( r * c2s ); )
    stbIF3( output3[0]  = ( r * c3s ); )
    stbIF4( output4[0]  = ( r * c4s ); )
    stbIF5( output5[0]  = ( r * c5s ); )
    stbIF6( output6[0]  = ( r * c6s ); )
    stbIF7( output7[0]  = ( r * c7s ); )
    #endif

    ++input;
    stbIF0( ++output0; ) stbIF1( ++output1; ) stbIF2( ++output2; ) stbIF3( ++output3; ) stbIF4( ++output4; ) stbIF5( ++output5; ) stbIF6( ++output6; ) stbIF7( ++output7; )
  }
}